

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::Seal
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance)

{
  Type *pTVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  DictionaryPropertyDescriptor<int> *pDVar2;
  ArrayObject *pAVar3;
  int index;
  int index_00;
  
  pTVar1 = &(this->super_DynamicTypeHandler).flags;
  *pTVar1 = *pTVar1 & 0xfe;
  for (index_00 = 0; this_00 = (this->propertyMap).ptr,
      index_00 < this_00->count - this_00->freeCount; index_00 = index_00 + 1) {
    pDVar2 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetReferenceAt(this_00,index_00);
    if (((pDVar2->Attributes & 0x10) == 0) || ((pDVar2->flags & IsShadowed) != None)) {
      pDVar2->Attributes = pDVar2->Attributes & 0xfd;
    }
  }
  pAVar3 = DynamicObject::GetObjectArray(instance);
  if (pAVar3 != (ArrayObject *)0x0) {
    (*(pAVar3->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x37])(pAVar3);
  }
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::Seal(DynamicObject* instance)
    {
        this->ClearFlags(IsExtensibleFlag);

        // Set [[Configurable]] flag of each property to false
        DictionaryPropertyDescriptor<T> *descriptor = nullptr;
        for (T index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if (descriptor->HasNonLetConstGlobal())
            {
                descriptor->Attributes &= (~PropertyConfigurable);
            }
        }

        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray)
        {
            objectArray->Seal();
        }

        return true;
    }